

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

QByteArray * __thiscall
QByteArray::replace(QByteArray *this,qsizetype pos,qsizetype len,QByteArrayView after)

{
  char *pcVar1;
  qsizetype alloc;
  Data *pDVar2;
  QByteArrayView after_00;
  QByteArray *pQVar3;
  long lVar4;
  char *__value;
  long in_FS_OFFSET;
  QVarLengthArray<char,_256LL> copy;
  back_insert_iterator<QVarLengthArray<char,_256LL>_> local_158;
  QVarLengthArray<char,_256LL> local_150;
  long local_38;
  
  __value = after.m_data;
  lVar4 = after.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (this->d).ptr;
  alloc = (this->d).size;
  if (__value < pcVar1 + alloc && pcVar1 <= __value) {
    memset(&local_150,0xaa,0x118);
    local_150.super_QVLABase<char>.super_QVLABaseBase.a = 0x100;
    local_150.super_QVLABase<char>.super_QVLABaseBase.s = 0;
    local_150.super_QVLABase<char>.super_QVLABaseBase.ptr =
         &local_150.super_QVLAStorage<1UL,_1UL,_256LL>;
    if (0x100 < lVar4) {
      QVLABase<char>::reallocate_impl
                (&local_150.super_QVLABase<char>,0x100,&local_150.super_QVLAStorage<1UL,_1UL,_256LL>
                 ,0,lVar4);
    }
    local_158.container = &local_150;
    if (0 < lVar4) {
      lVar4 = lVar4 + 1;
      do {
        std::back_insert_iterator<QVarLengthArray<char,_256LL>_>::operator=(&local_158,__value);
        __value = __value + 1;
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    after_00.m_data = (storage_type *)local_150.super_QVLABase<char>.super_QVLABaseBase.ptr;
    after_00.m_size = local_150.super_QVLABase<char>.super_QVLABaseBase.s;
    this = replace(this,pos,len,after_00);
    if ((QVLAStorage<1UL,_1UL,_256LL> *)local_150.super_QVLABase<char>.super_QVLABaseBase.ptr !=
        &local_150.super_QVLAStorage<1UL,_1UL,_256LL>) {
      QtPrivate::sizedFree
                (local_150.super_QVLABase<char>.super_QVLABaseBase.ptr,
                 local_150.super_QVLABase<char>.super_QVLABaseBase.a);
    }
  }
  else {
    if ((lVar4 != len) || (alloc < len + pos)) {
      remove(this,(char *)pos);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        pQVar3 = insert(this,pos,after);
        return pQVar3;
      }
      goto LAB_00307779;
    }
    if (0 < len) {
      pDVar2 = (this->d).d;
      if ((pDVar2 == (Data *)0x0) ||
         (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        reallocData(this,alloc,KeepSize);
      }
      memcpy((this->d).ptr + pos,__value,len);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
LAB_00307779:
  __stack_chk_fail();
}

Assistant:

QByteArray &QByteArray::replace(qsizetype pos, qsizetype len, QByteArrayView after)
{
    if (QtPrivate::q_points_into_range(after.data(), d)) {
        QVarLengthArray copy(after.data(), after.data() + after.size());
        return replace(pos, len, QByteArrayView{copy});
    }
    if (len == after.size() && (pos + len <= size())) {
        // same size: in-place replacement possible
        if (len > 0) {
            detach();
            memcpy(d.data() + pos, after.data(), len*sizeof(char));
        }
        return *this;
    } else {
        // ### optimize me
        remove(pos, len);
        return insert(pos, after);
    }
}